

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

target_ulong helper_msa_cfcmsa_mips64(CPUMIPSState_conflict5 *env,uint32_t cs)

{
  uint32_t cs_local;
  CPUMIPSState_conflict5 *env_local;
  
  if (cs == 0) {
    env_local = (CPUMIPSState_conflict5 *)(long)env->msair;
  }
  else if (cs == 1) {
    env_local = (CPUMIPSState_conflict5 *)(long)(int)((env->active_tc).msacsr & 0x107ffff);
  }
  else {
    env_local = (CPUMIPSState_conflict5 *)0x0;
  }
  return (target_ulong)env_local;
}

Assistant:

target_ulong helper_msa_cfcmsa(CPUMIPSState *env, uint32_t cs)
{
    switch (cs) {
    case 0:
        return env->msair;
    case 1:
        return env->active_tc.msacsr & MSACSR_MASK;
    }
    return 0;
}